

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint32 crnd::crnd_crn_format_to_fourcc(crn_format fmt)

{
  uint32 uVar1;
  
  uVar1 = 0;
  if ((ulong)fmt < 0xf) {
    uVar1 = *(uint32 *)(&DAT_00186960 + fmt * 4);
  }
  return uVar1;
}

Assistant:

uint32 crnd_crn_format_to_fourcc(crn_format fmt)
    {
        switch (fmt)
        {
            case cCRNFmtDXT1:
                return CRND_FOURCC('D', 'X', 'T', '1');
            case cCRNFmtDXT3:
                return CRND_FOURCC('D', 'X', 'T', '3');
            case cCRNFmtDXT5:
                return CRND_FOURCC('D', 'X', 'T', '5');
            case cCRNFmtDXN_XY:
                return CRND_FOURCC('A', '2', 'X', 'Y');
            case cCRNFmtDXN_YX:
                return CRND_FOURCC('A', 'T', 'I', '2');
            case cCRNFmtDXT5A:
                return CRND_FOURCC('A', 'T', 'I', '1');
            case cCRNFmtDXT5_CCxY:
                return CRND_FOURCC('C', 'C', 'x', 'Y');
            case cCRNFmtDXT5_xGxR:
                return CRND_FOURCC('x', 'G', 'x', 'R');
            case cCRNFmtDXT5_xGBR:
                return CRND_FOURCC('x', 'G', 'B', 'R');
            case cCRNFmtDXT5_AGBR:
                return CRND_FOURCC('A', 'G', 'B', 'R');
            case cCRNFmtETC1:
                return CRND_FOURCC('E', 'T', 'C', '1');
            case cCRNFmtETC2:
                return CRND_FOURCC('E', 'T', 'C', '2');
            case cCRNFmtETC2A:
                return CRND_FOURCC('E', 'T', '2', 'A');
            case cCRNFmtETC1S:
                return CRND_FOURCC('E', 'T', '1', 'S');
            case cCRNFmtETC2AS:
                return CRND_FOURCC('E', '2', 'A', 'S');
            default:
                break;
        }
        CRND_ASSERT(false);
        return 0;
    }